

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.cc
# Opt level: O0

int OBJ_sn2nid(char *s)

{
  ushort *puVar1;
  ASN1_OBJECT *pAVar2;
  uint16_t *nid_ptr;
  ASN1_OBJECT templ;
  ASN1_OBJECT *match;
  char *short_name_local;
  
  CRYPTO_MUTEX_lock_read(&global_added_lock);
  if (global_added_by_short_name != (lhash_st_ASN1_OBJECT *)0x0) {
    nid_ptr = (uint16_t *)s;
    templ._32_8_ = lh_ASN1_OBJECT_retrieve(global_added_by_short_name,(ASN1_OBJECT *)&nid_ptr);
    if ((ASN1_OBJECT *)templ._32_8_ != (ASN1_OBJECT *)0x0) {
      CRYPTO_MUTEX_unlock_read(&global_added_lock);
      return *(int *)(templ._32_8_ + 0x10);
    }
    templ.flags = 0;
    templ._36_4_ = 0;
  }
  CRYPTO_MUTEX_unlock_read(&global_added_lock);
  puVar1 = (ushort *)bsearch(s,kNIDsInShortNameOrder,0x3ba,2,short_name_cmp);
  if (puVar1 == (ushort *)0x0) {
    short_name_local._4_4_ = 0;
  }
  else {
    pAVar2 = get_builtin_object((uint)*puVar1);
    short_name_local._4_4_ = pAVar2->nid;
  }
  return short_name_local._4_4_;
}

Assistant:

int OBJ_sn2nid(const char *short_name) {
  CRYPTO_MUTEX_lock_read(&global_added_lock);
  if (global_added_by_short_name != NULL) {
    ASN1_OBJECT *match, templ;

    templ.sn = short_name;
    match = lh_ASN1_OBJECT_retrieve(global_added_by_short_name, &templ);
    if (match != NULL) {
      CRYPTO_MUTEX_unlock_read(&global_added_lock);
      return match->nid;
    }
  }
  CRYPTO_MUTEX_unlock_read(&global_added_lock);

  const uint16_t *nid_ptr = reinterpret_cast<const uint16_t *>(
      bsearch(short_name, kNIDsInShortNameOrder,
              OPENSSL_ARRAY_SIZE(kNIDsInShortNameOrder),
              sizeof(kNIDsInShortNameOrder[0]), short_name_cmp));
  if (nid_ptr == NULL) {
    return NID_undef;
  }

  return get_builtin_object(*nid_ptr)->nid;
}